

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_crl(X509_STORE_CTX *ctx,X509_CRL *crl)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  EVP_PKEY *r;
  EVP_PKEY *ikey;
  int chnum;
  int cnum;
  X509 *issuer;
  X509_CRL *crl_local;
  X509_STORE_CTX *ctx_local;
  
  iVar2 = ctx->error_depth;
  sVar3 = sk_X509_num(ctx->chain);
  iVar1 = (int)sVar3 + -1;
  if (ctx->current_crl_issuer == (X509 *)0x0) {
    if (iVar2 < iVar1) {
      _chnum = sk_X509_value(ctx->chain,(long)(iVar2 + 1));
    }
    else {
      _chnum = sk_X509_value(ctx->chain,(long)iVar1);
      iVar2 = x509_check_issued_with_callback(ctx,_chnum,_chnum);
      if (iVar2 == 0) {
        ctx->error = 0x21;
        iVar2 = call_verify_cb(0,ctx);
        if (iVar2 == 0) {
          return 0;
        }
      }
    }
  }
  else {
    _chnum = ctx->current_crl_issuer;
  }
  if (_chnum != (X509 *)0x0) {
    if (((_chnum->ex_flags & 2) != 0) && ((_chnum->ex_kusage & 2) == 0)) {
      ctx->error = 0x23;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if ((ctx->current_crl_score & 0x80U) == 0) {
      ctx->error = 0x2c;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if ((crl->idp_flags & 2U) != 0) {
      ctx->error = 0x29;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if (((ctx->current_crl_score & 0x40U) == 0) && (iVar2 = check_crl_time(ctx,crl,1), iVar2 == 0))
    {
      return 0;
    }
    r = (EVP_PKEY *)X509_get0_pubkey(_chnum);
    if (r == (EVP_PKEY *)0x0) {
      ctx->error = 6;
      iVar2 = call_verify_cb(0,ctx);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      iVar2 = X509_CRL_verify((X509_CRL *)crl,r);
      if (iVar2 < 1) {
        ctx->error = 8;
        iVar2 = call_verify_cb(0,ctx);
        if (iVar2 == 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static int check_crl(X509_STORE_CTX *ctx, X509_CRL *crl) {
  X509 *issuer = NULL;
  int cnum = ctx->error_depth;
  int chnum = (int)sk_X509_num(ctx->chain) - 1;
  // If we have an alternative CRL issuer cert use that. Otherwise, it is the
  // issuer of the current certificate.
  if (ctx->current_crl_issuer) {
    issuer = ctx->current_crl_issuer;
  } else if (cnum < chnum) {
    issuer = sk_X509_value(ctx->chain, cnum + 1);
  } else {
    issuer = sk_X509_value(ctx->chain, chnum);
    // If not self signed, can't check signature
    if (!x509_check_issued_with_callback(ctx, issuer, issuer)) {
      ctx->error = X509_V_ERR_UNABLE_TO_GET_CRL_ISSUER;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
  }

  if (issuer) {
    // Check for cRLSign bit if keyUsage present
    if ((issuer->ex_flags & EXFLAG_KUSAGE) &&
        !(issuer->ex_kusage & X509v3_KU_CRL_SIGN)) {
      ctx->error = X509_V_ERR_KEYUSAGE_NO_CRL_SIGN;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }

    if (!(ctx->current_crl_score & CRL_SCORE_SCOPE)) {
      ctx->error = X509_V_ERR_DIFFERENT_CRL_SCOPE;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }

    if (crl->idp_flags & IDP_INVALID) {
      ctx->error = X509_V_ERR_INVALID_EXTENSION;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }

    if (!(ctx->current_crl_score & CRL_SCORE_TIME)) {
      if (!check_crl_time(ctx, crl, 1)) {
        return 0;
      }
    }

    // Attempt to get issuer certificate public key
    EVP_PKEY *ikey = X509_get0_pubkey(issuer);
    if (!ikey) {
      ctx->error = X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    } else {
      // Verify CRL signature
      if (X509_CRL_verify(crl, ikey) <= 0) {
        ctx->error = X509_V_ERR_CRL_SIGNATURE_FAILURE;
        if (!call_verify_cb(0, ctx)) {
          return 0;
        }
      }
    }
  }

  return 1;
}